

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void __thiscall CP::list<int>::print(list<int> *this)

{
  ostream *poVar1;
  node *pnVar2;
  node *pnVar3;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Size ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,": ");
  pnVar2 = this->mHeader;
  pnVar3 = pnVar2;
  while (pnVar3 = pnVar3->next, pnVar2 != pnVar3) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pnVar3->data);
    std::operator<<(poVar1," ");
    pnVar2 = this->mHeader;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void print() {
      std::cout << "Size " << mSize << ": ";
      int i = 0;
      iterator before;
      for (iterator it = begin();it!=end();before = it, it++,i++) {
        std::cout << *it << " ";
      }
      std::cout << std::endl;
    }